

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timestamp.cpp
# Opt level: O2

timestamp_t duckdb::Timestamp::FromDatetime(date_t date,dtime_t time)

{
  bool bVar1;
  ConversionException *this;
  allocator local_41;
  timestamp_t result;
  string local_38;
  
  bVar1 = TryFromDatetime(date,time,&result);
  if (bVar1) {
    return (timestamp_t)result.value;
  }
  this = (ConversionException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string
            ((string *)&local_38,"Date and time not in timestamp range",&local_41);
  ConversionException::ConversionException(this,&local_38);
  __cxa_throw(this,&ConversionException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

timestamp_t Timestamp::FromDatetime(date_t date, dtime_t time) {
	timestamp_t result;
	if (!TryFromDatetime(date, time, result)) {
		throw ConversionException("Date and time not in timestamp range");
	}
	return result;
}